

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  path local_38;
  
  std::filesystem::__cxx11::path::path<char[39],std::filesystem::__cxx11::path>
            (&local_38,(char (*) [39])"/home/fourstring/CLionProjects/lsmtree",auto_format);
  std::filesystem::current_path(&local_38);
  std::filesystem::__cxx11::path::~path(&local_38);
  paVar1 = &local_38._M_pathname.field_2;
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"should be able to move a memtable","");
  it<bool(*)()>(&local_38._M_pathname,test_memtable_move);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"should distinguish two strings by space in a binary file","");
  it<bool(*)()>(&local_38._M_pathname,test_string_fileio);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"should read/write number as bytes correctly","");
  it<bool(*)()>(&local_38._M_pathname,test_bytes_level_IO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"should follow definition of MemTable","");
  it<bool(*)()>(&local_38._M_pathname,test_memtable_behavior);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"should correctly implement SSTable","");
  it<bool(*)()>(&local_38._M_pathname,test_SSTable_behavior);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "should correctly read/write bytes between SSTable in memory and disk.","");
  it<bool(*)()>(&local_38._M_pathname,test_SSTable_fileIO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"should correctly implement DiskTableNode","");
  it<bool(*)()>(&local_38._M_pathname,test_DiskTableNode_behavior);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"should merge data correctly","");
  it<bool(*)()>(&local_38._M_pathname,test_SSTableData_merge);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"should correctly erase data in vector","");
  it<bool(*)()>(&local_38._M_pathname,test_vector_erase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_38._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"should read sstable correctly","");
  it<bool(*)()>(&local_38._M_pathname,test_SSTable_input);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_pathname._M_dataplus._M_p,
                    local_38._M_pathname.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main() {
    current_path("/home/fourstring/CLionProjects/lsmtree");
    it("should be able to move a memtable", test_memtable_move);
    it("should distinguish two strings by space in a binary file", test_string_fileio);
    it("should read/write number as bytes correctly", test_bytes_level_IO);
    it("should follow definition of MemTable", test_memtable_behavior);
    it("should correctly implement SSTable", test_SSTable_behavior);
    it("should correctly read/write bytes between SSTable in memory and disk.", test_SSTable_fileIO);
    it("should correctly implement DiskTableNode", test_DiskTableNode_behavior);
    it("should merge data correctly", test_SSTableData_merge);
    it("should correctly erase data in vector", test_vector_erase);
    it("should read sstable correctly", test_SSTable_input);
}